

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::serializeGrammars(XMLGrammarPoolImpl *this,BinOutputStream *binOut)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *toEnum;
  bool bVar1;
  MemoryManager *pMVar2;
  XSerializationException *this_00;
  undefined1 local_c0 [8];
  XSerializeEngine serEng;
  undefined1 local_48 [8];
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  BinOutputStream *binOut_local;
  XMLGrammarPoolImpl *this_local;
  
  toEnum = this->fGrammarRegistry;
  grammarEnum.fMemoryManager = (MemoryManager *)binOut;
  pMVar2 = XMLGrammarPool::getMemoryManager(&this->super_XMLGrammarPool);
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)local_48,
             toEnum,false,pMVar2);
  bVar1 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::hasMoreElements
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     local_48);
  if (!bVar1) {
    this_00 = (XSerializationException *)__cxa_allocate_exception(0x30);
    pMVar2 = XMLGrammarPool::getMemoryManager(&this->super_XMLGrammarPool);
    XSerializationException::XSerializationException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
               ,0xf3,XSer_GrammarPool_Empty,pMVar2);
    __cxa_throw(this_00,&XSerializationException::typeinfo,
                XSerializationException::~XSerializationException);
  }
  XSerializeEngine::XSerializeEngine
            ((XSerializeEngine *)local_c0,(BinOutputStream *)grammarEnum.fMemoryManager,
             &this->super_XMLGrammarPool,0x2000);
  XSerializeEngine::operator<<((XSerializeEngine *)local_c0,7);
  XSerializeEngine::operator<<((XSerializeEngine *)local_c0,(bool)(this->fLocked & 1));
  (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[3])(this->fStringPool,local_c0);
  XTemplateSerializer::storeObject(this->fGrammarRegistry,(XSerializeEngine *)local_c0);
  XSerializeEngine::~XSerializeEngine((XSerializeEngine *)local_c0);
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  ~RefHashTableOfEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)local_48);
  return;
}

Assistant:

void XMLGrammarPoolImpl::serializeGrammars(BinOutputStream* const binOut)
{
    RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarRegistry, false, getMemoryManager());
    if (!(grammarEnum.hasMoreElements()))
    {
        ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_GrammarPool_Empty, getMemoryManager());
    }

    XSerializeEngine  serEng(binOut, this);

    //version information
    serEng<<(unsigned int)XERCES_GRAMMAR_SERIALIZATION_LEVEL;

    //lock status
    serEng<<fLocked;

    //StringPool, don't use <<
    fStringPool->serialize(serEng);

    /***
     * Serialize RefHashTableOf<Grammar>*    fGrammarRegistry;
     ***/
    XTemplateSerializer::storeObject(fGrammarRegistry, serEng);
}